

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# packet_encoding.h
# Opt level: O3

void ximu::PacketEncoding::
     encodePacket<__gnu_cxx::__normal_iterator<unsigned_char*,std::vector<unsigned_char,std::allocator<unsigned_char>>>,std::back_insert_iterator<std::vector<unsigned_char,std::allocator<unsigned_char>>>>
               (__normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                src,size_t count,
               back_insert_iterator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
               dest)

{
  uint uVar1;
  ulong uVar2;
  ulong __n;
  unsigned_long __n2;
  undefined1 local_68 [8];
  vector<unsigned_char,_std::allocator<unsigned_char>_> encodedPacket;
  vector<unsigned_char,_std::allocator<unsigned_char>_> shiftRegister;
  
  if (count != 0) {
    uVar1 = encodedPacketSize((uint)count);
    __n = (ulong)uVar1;
    encodedPacket.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage._0_1_ = 0;
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_68,__n,
               (value_type *)
               &encodedPacket.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                _M_impl.super__Vector_impl_data._M_end_of_storage,
               (allocator_type *)
               ((long)&shiftRegister.
                       super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                       super__Vector_impl_data._M_end_of_storage + 7));
    shiftRegister.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage._7_1_ = 0;
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
               &encodedPacket.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                _M_impl.super__Vector_impl_data._M_end_of_storage,__n,
               (value_type *)
               ((long)&shiftRegister.
                       super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                       super__Vector_impl_data._M_end_of_storage + 7),
               (allocator_type *)
               ((long)&shiftRegister.
                       super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                       super__Vector_impl_data._M_end_of_storage + 6));
    memmove((void *)CONCAT71(encodedPacket.
                             super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                             _M_impl.super__Vector_impl_data._M_end_of_storage._1_7_,
                             encodedPacket.
                             super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                             _M_impl.super__Vector_impl_data._M_end_of_storage._0_1_),src._M_current
            ,count);
    if (__n == 0) {
      encodedPacket.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start[-1] =
           encodedPacket.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
           super__Vector_impl_data._M_start[-1] | 0x80;
    }
    else {
      uVar2 = 0;
      do {
        rightShiftBytes((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                        &encodedPacket.
                         super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                         super__Vector_impl_data._M_end_of_storage);
        *(uchar *)((long)local_68 + uVar2) =
             *(uchar *)(CONCAT71(encodedPacket.
                                 super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                 _M_impl.super__Vector_impl_data._M_end_of_storage._1_7_,
                                 encodedPacket.
                                 super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                 _M_impl.super__Vector_impl_data._M_end_of_storage._0_1_) + uVar2);
        *(undefined1 *)
         (CONCAT71(encodedPacket.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                   _M_impl.super__Vector_impl_data._M_end_of_storage._1_7_,
                   encodedPacket.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                   _M_impl.super__Vector_impl_data._M_end_of_storage._0_1_) + uVar2) = 0;
        uVar2 = uVar2 + 1;
      } while (__n != uVar2);
      encodedPacket.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start[-1] =
           encodedPacket.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
           super__Vector_impl_data._M_start[-1] | 0x80;
      if (uVar1 != 0) {
        std::__copy_move<false,false,std::random_access_iterator_tag>::
        __copy_m<unsigned_char*,std::back_insert_iterator<std::vector<unsigned_char,std::allocator<unsigned_char>>>>
                  ((uchar *)local_68,(uchar *)((long)local_68 + __n),dest);
      }
    }
    if ((void *)CONCAT71(encodedPacket.
                         super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                         super__Vector_impl_data._M_end_of_storage._1_7_,
                         encodedPacket.
                         super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                         super__Vector_impl_data._M_end_of_storage._0_1_) != (void *)0x0) {
      operator_delete((void *)CONCAT71(encodedPacket.
                                       super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                       ._M_impl.super__Vector_impl_data._M_end_of_storage._1_7_,
                                       encodedPacket.
                                       super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                       ._M_impl.super__Vector_impl_data._M_end_of_storage._0_1_));
    }
    if (local_68 != (undefined1  [8])0x0) {
      operator_delete((void *)local_68);
    }
  }
  return;
}

Assistant:

static void encodePacket(InputIterator src, size_t count,
                           OutputIterator dest) {
    // need at least one byte to encode 
    if (count < 1)
      return;

    // calculate new message length
    unsigned encodedLength = encodedPacketSize(count);
    std::vector<unsigned char> encodedPacket(encodedLength, 0);
    std::vector<unsigned char> shiftRegister(encodedLength, 0);
    
    // fill the shift register
    std::copy_n(src, count, shiftRegister.begin());

    // shift
    for (unsigned idx = 0; idx != encodedLength; ++idx) {
      rightShiftBytes(shiftRegister);           // r-shift clear msb i
      encodedPacket[idx] = shiftRegister[idx];  // store encoded byte
      shiftRegister[idx] = 0;                   // clear byte from sr
    }
    // set msb of framing byte
    encodedPacket.back() |= 0x80;
    std::copy_n(encodedPacket.begin(), encodedLength, dest);
  }